

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O3

void __thiscall gl4cts::BufferStorage::Buffer::MapOwner::~MapOwner(MapOwner *this)

{
  this->m_data = (GLvoid *)0x0;
  if (this->m_buffer != (Buffer *)0x0) {
    Buffer::Bind(this->m_buffer);
    UnMap(this->m_buffer);
    this->m_buffer = (Buffer *)0x0;
  }
  return;
}

Assistant:

Buffer::MapOwner::~MapOwner()
{
	m_data = 0;
	if (0 != m_buffer)
	{
		m_buffer->Bind();
		m_buffer->UnMap();
		m_buffer = 0;
	}
}